

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# numbers.cc
# Opt level: O0

bool absl::numbers_internal::safe_strto64_base(string_view text,Nonnull<int64_t_*> value,int base)

{
  string_view text_00;
  bool bVar1;
  int in_ECX;
  Nonnull<long_*> in_RDX;
  char *in_RSI;
  size_t in_RDI;
  
  text_00._M_str = in_RSI;
  text_00._M_len = in_RDI;
  bVar1 = anon_unknown_0::safe_int_internal<long>(text_00,in_RDX,in_ECX);
  return bVar1;
}

Assistant:

bool safe_strto64_base(absl::string_view text, absl::Nonnull<int64_t*> value,
                       int base) {
  return safe_int_internal<int64_t>(text, value, base);
}